

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioWaveTxAt(void)

{
  long lVar1;
  rawWaveInfo_t *prVar2;
  uint uVar3;
  uint uVar4;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveTxAt_cold_1();
  }
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    gpioWaveTxAt_cold_2();
    return -0x1f;
  }
  uVar3 = 0xffffd8f1;
  if (dmaOut[1] != 0) {
    lVar1 = 0;
    do {
      uVar4 = dmaOut[1] - *(int *)(dmaOBus + lVar1);
      if (uVar4 < 0xec0) goto LAB_0011b6bb;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xd5);
    if (dmaOut[1] != 0) {
      lVar1 = 0;
      do {
        uVar4 = dmaOut[1] - *(int *)(dmaOBus + lVar1);
        if (uVar4 < 0xec0) goto LAB_0011b6bb;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0xd5);
      uVar3 = 0xffffd8f2;
    }
  }
LAB_0011b6fa:
  return -uVar3;
LAB_0011b6bb:
  uVar3 = (int)lVar1 * 0x76 + (uVar4 >> 5);
  if (-1 < (int)uVar3) {
    prVar2 = waveInfo;
    lVar1 = 0;
    while (((prVar2->deleted != 0 || ((int)uVar3 < (int)(uint)prVar2->botCB)) ||
           (prVar2->topCB < uVar3))) {
      lVar1 = lVar1 + 1;
      prVar2 = prVar2 + 1;
      if (lVar1 == 0xfa) {
        return 0x270e;
      }
    }
    return (int)lVar1;
  }
  goto LAB_0011b6fa;
}

Assistant:

int gpioWaveTxAt(void)
{
   int i, cb;

   DBG(DBG_USER, "");

   CHECK_INITED;

   cb = dmaNowAtOCB();

   if (cb < 0) return -cb;

   for (i=0; i<PI_MAX_WAVES; i++)
   {
      if ( !waveInfo[i].deleted &&
          (cb >= waveInfo[i].botCB) &&
          (cb <= waveInfo[i].topCB) ) return i;
   }

   return PI_WAVE_NOT_FOUND;
}